

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatVec.c
# Opt level: O1

Msat_IntVec_t * Msat_IntVecDupArray(Msat_IntVec_t *pVec)

{
  Msat_IntVec_t *pMVar1;
  
  pMVar1 = (Msat_IntVec_t *)malloc(0x10);
  pMVar1->nSize = pVec->nSize;
  pMVar1->nCap = pVec->nCap;
  pMVar1->pArray = pVec->pArray;
  pVec->pArray = (int *)0x0;
  pVec->nSize = 0;
  pVec->nCap = 0;
  return pMVar1;
}

Assistant:

Msat_IntVec_t * Msat_IntVecDupArray( Msat_IntVec_t * pVec )
{
    Msat_IntVec_t * p;
    p = ABC_ALLOC( Msat_IntVec_t, 1 );
    p->nSize  = pVec->nSize;
    p->nCap   = pVec->nCap;
    p->pArray = pVec->pArray;
    pVec->nSize  = 0;
    pVec->nCap   = 0;
    pVec->pArray = NULL;
    return p;
}